

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  lest lVar1;
  expected<int,_int> *in_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  lest local_70;
  long *local_68;
  long local_60;
  long local_58 [2];
  ForStreamable<nonstd::expected_lite::expected<int,_int>,_std::string> local_48;
  
  lVar1 = (*(lest **)this)[4];
  make_string<nonstd::expected_lite::expected<int,int>>(&local_48,*(lest **)this,in_RDX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == &local_48.field_2) {
    aStack_a0._8_8_ = local_48.field_2._8_8_;
  }
  else {
    aStack_a0._M_allocated_capacity._4_4_ = local_48.field_2._M_allocated_capacity._4_4_;
    aStack_a0._M_allocated_capacity._0_4_ = local_48.field_2._M_allocated_capacity._0_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &aStack_a0) {
      local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_48._M_dataplus._M_p;
      local_80._M_allocated_capacity = aStack_a0._M_allocated_capacity;
      goto LAB_0022dfd6;
    }
  }
  local_90 = &local_80;
  local_80._M_allocated_capacity =
       CONCAT44(local_48.field_2._M_allocated_capacity._4_4_,
                local_48.field_2._M_allocated_capacity._0_4_);
  local_80._8_4_ = aStack_a0._8_4_;
  local_80._12_4_ = aStack_a0._12_4_;
LAB_0022dfd6:
  aStack_a0._M_allocated_capacity._4_4_ = local_48.field_2._M_allocated_capacity._4_4_;
  aStack_a0._M_allocated_capacity._0_4_ = local_48.field_2._M_allocated_capacity._0_4_;
  aStack_a0._M_allocated_capacity = aStack_a0._M_allocated_capacity & 0xffffffffffffff00;
  local_70 = lVar1;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,local_90,
             local_90->_M_local_buf +
             CONCAT44(local_48._M_string_length._4_4_,(undefined4)local_48._M_string_length));
  __return_storage_ptr__->passed = (bool)local_70;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_68,local_60 + (long)local_68);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result{ !!lhs, to_string( lhs ) }; }